

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O0

int ffdrrg(fitsfile *fptr,char *ranges,int *status)

{
  LONGLONG maxrows;
  int iVar1;
  long *minrow_00;
  long *maxrow_00;
  long *rownum;
  LONGLONG naxis2;
  long kk;
  long jj;
  long *rowarray;
  long nrows;
  long *maxrow;
  long *minrow;
  int local_38;
  int ii;
  int nranges2;
  int nranges;
  char *cptr;
  int *status_local;
  char *ranges_local;
  fitsfile *fptr_local;
  
  if (*status < 1) {
    cptr = (char *)status;
    status_local = (int *)ranges;
    ranges_local = (char *)fptr;
    if (fptr->HDUposition == fptr->Fptr->curhdu) {
      if ((fptr->Fptr->datastart == -1) && (iVar1 = ffrdef(fptr,status), 0 < iVar1)) {
        return *(int *)cptr;
      }
    }
    else {
      ffmahd(fptr,fptr->HDUposition + 1,(int *)0x0,status);
    }
    if (*(int *)(*(long *)(ranges_local + 8) + 0x58) == 0) {
      ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
      cptr[0] = -0x15;
      cptr[1] = '\0';
      cptr[2] = '\0';
      cptr[3] = '\0';
      fptr_local._4_4_ = 0xeb;
    }
    else {
      maxrows = *(LONGLONG *)(*(long *)(ranges_local + 8) + 0x3c0);
      _nranges2 = status_local;
      ii = 1;
      while (_nranges2 = (int *)strchr((char *)_nranges2,0x2c), _nranges2 != (int *)0x0) {
        _nranges2 = (int *)((long)_nranges2 + 1);
        ii = ii + 1;
      }
      minrow_00 = (long *)calloc((long)ii,8);
      maxrow_00 = (long *)calloc((long)ii,8);
      if ((minrow_00 == (long *)0x0) || (maxrow_00 == (long *)0x0)) {
        cptr[0] = 'q';
        cptr[1] = '\0';
        cptr[2] = '\0';
        cptr[3] = '\0';
        ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
        if (maxrow_00 != (long *)0x0) {
          free(maxrow_00);
        }
        if (minrow_00 != (long *)0x0) {
          free(minrow_00);
        }
        fptr_local._4_4_ = *(int *)cptr;
      }
      else {
        ffrwrg((char *)status_local,maxrows,ii,&local_38,minrow_00,maxrow_00,(int *)cptr);
        if ((*(int *)cptr < 1) && (local_38 != 0)) {
          rowarray = (long *)0x0;
          for (minrow._4_4_ = 0; minrow._4_4_ < local_38; minrow._4_4_ = minrow._4_4_ + 1) {
            rowarray = (long *)((long)rowarray +
                               (maxrow_00[minrow._4_4_] - minrow_00[minrow._4_4_]) + 1);
          }
          rownum = (long *)calloc((size_t)rowarray,8);
          if (rownum == (long *)0x0) {
            cptr[0] = 'q';
            cptr[1] = '\0';
            cptr[2] = '\0';
            cptr[3] = '\0';
            ffpmsg("failed to allocate memory for row array (ffdrrg)");
            fptr_local._4_4_ = *(int *)cptr;
          }
          else {
            naxis2 = 0;
            for (minrow._4_4_ = 0; minrow._4_4_ < local_38; minrow._4_4_ = minrow._4_4_ + 1) {
              for (kk = minrow_00[minrow._4_4_]; kk <= maxrow_00[minrow._4_4_]; kk = kk + 1) {
                rownum[naxis2] = kk;
                naxis2 = naxis2 + 1;
              }
            }
            ffdrws((fitsfile *)ranges_local,rownum,(long)rowarray,(int *)cptr);
            free(rownum);
            free(maxrow_00);
            free(minrow_00);
            fptr_local._4_4_ = *(int *)cptr;
          }
        }
        else {
          free(maxrow_00);
          free(minrow_00);
          fptr_local._4_4_ = *(int *)cptr;
        }
      }
    }
  }
  else {
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffdrrg(fitsfile *fptr,  /* I - FITS file pointer to table               */
           char *ranges,    /* I - ranges of rows to delete (1 = first)     */
           int *status)     /* IO - error status                            */
/*
 delete the ranges of rows from the table (1 = first row of table).

The 'ranges' parameter typically looks like:
    '10-20, 30 - 40, 55' or '50-'
and gives a list of rows or row ranges separated by commas.
*/
{
    char *cptr;
    int nranges, nranges2, ii;
    long *minrow, *maxrow, nrows, *rowarray, jj, kk;
    LONGLONG naxis2;
    
    if (*status > 0)
        return(*status);

    if (fptr->HDUposition != (fptr->Fptr)->curhdu)
    {
        ffmahd(fptr, (fptr->HDUposition) + 1, NULL, status);
    }
        /* rescan header if data structure is undefined */
    else if ((fptr->Fptr)->datastart == DATA_UNDEFINED)
        if ( ffrdef(fptr, status) > 0)               
            return(*status);

    if ((fptr->Fptr)->hdutype == IMAGE_HDU)
    {
        ffpmsg("Can only delete rows in TABLE or BINTABLE extension (ffdrrg)");
        return(*status = NOT_TABLE);
    }

    /* the NAXIS2 keyword may not be up to date, so use the structure value */
    naxis2 = (fptr->Fptr)->numrows;

    /* find how many ranges were specified ( = no. of commas in string + 1) */
    cptr = ranges;
    for (nranges = 1; (cptr = strchr(cptr, ',')); nranges++)
        cptr++;
 
    minrow = calloc(nranges, sizeof(long));
    maxrow = calloc(nranges, sizeof(long));

    if (!minrow || !maxrow) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row ranges (ffdrrg)");
        if (maxrow) free(maxrow);
        if (minrow) free(minrow);
        return(*status);
    }

    /* parse range list into array of range min and max values */
    ffrwrg(ranges, naxis2, nranges, &nranges2, minrow, maxrow, status);
    if (*status > 0 || nranges2 == 0) {
        free(maxrow);
        free(minrow);
        return(*status);
    }

    /* determine total number or rows to delete */
    nrows = 0;
    for (ii = 0; ii < nranges2; ii++) {
       nrows = nrows + maxrow[ii] - minrow[ii] + 1;
    }

    rowarray = calloc(nrows, sizeof(long));
    if (!rowarray) {
        *status = MEMORY_ALLOCATION;
        ffpmsg("failed to allocate memory for row array (ffdrrg)");
        return(*status);
    }

    for (kk = 0, ii = 0; ii < nranges2; ii++) {
       for (jj = minrow[ii]; jj <= maxrow[ii]; jj++) {
           rowarray[kk] = jj;
           kk++;
       }
    }

    /* delete the rows */
    ffdrws(fptr, rowarray, nrows, status);
    
    free(rowarray);
    free(maxrow);
    free(minrow);
    return(*status);
}